

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallInfo.cpp
# Opt level: O0

ArgSlot Js::CallInfo::GetArgCountWithoutExtraArgs(CallFlags flags,ArgSlot count)

{
  bool bVar1;
  undefined2 local_10;
  ArgSlot newCount;
  ArgSlot count_local;
  CallFlags flags_local;
  
  bVar1 = HasExtraArg(flags);
  local_10 = count;
  if (bVar1) {
    if (count == 0) {
      ::Math::DefaultOverflowPolicy();
    }
    local_10 = count - 1;
  }
  return local_10;
}

Assistant:

ArgSlot CallInfo::GetArgCountWithoutExtraArgs(CallFlags flags, ArgSlot count)
    {
        ArgSlot newCount = count;
        if (CallInfo::HasExtraArg(flags))
        {
            if (count == 0)
            {
                ::Math::DefaultOverflowPolicy();
            }
            newCount = count - 1;
        }
        return newCount;
    }